

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

void __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
::insert_fixup(map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
               *this,Node *x)

{
  color_type cVar1;
  Node *pNVar2;
  Node *y;
  Node *pNVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node **ppNVar6;
  
  pNVar3 = x->parent;
  if (pNVar3->color == RED) {
    ppNVar6 = &x->parent;
    pNVar2 = this->nil;
    do {
      pNVar5 = pNVar3->parent->left;
      pNVar4 = pNVar3;
      if (pNVar5 == pNVar3) {
        pNVar5 = pNVar3->parent->right;
        if (pNVar5->color != RED) {
          if (pNVar3->right == x) {
            pNVar5 = x->left;
            if (pNVar5 != pNVar2) {
              pNVar5->parent = pNVar3;
            }
            pNVar3->right = pNVar5;
            pNVar5 = pNVar3->parent;
            (&pNVar5->left)[pNVar5->left != pNVar3] = x;
            *ppNVar6 = pNVar5;
            pNVar3->parent = x;
            x->left = pNVar3;
            pNVar4 = x;
            x = pNVar3;
          }
          pNVar5 = pNVar4->right;
          pNVar3 = pNVar4->parent;
          if (pNVar5 != pNVar2) {
            pNVar5->parent = pNVar3;
          }
          pNVar3->left = pNVar5;
          pNVar5 = pNVar3->parent;
          (&pNVar5->left)[pNVar5->left != pNVar3] = pNVar4;
          pNVar4->parent = pNVar5;
          pNVar3->parent = pNVar4;
          pNVar4->right = pNVar3;
          goto LAB_00118b44;
        }
LAB_00118a5a:
        pNVar5->color = BLACK;
        pNVar3->color = BLACK;
        x = pNVar5->parent;
        x->color = RED;
      }
      else {
        if (pNVar5->color == RED) goto LAB_00118a5a;
        if (pNVar3->left == x) {
          pNVar5 = x->right;
          if (pNVar5 != pNVar2) {
            pNVar5->parent = pNVar3;
          }
          pNVar3->left = pNVar5;
          pNVar5 = pNVar3->parent;
          (&pNVar5->left)[pNVar5->left != pNVar3] = x;
          *ppNVar6 = pNVar5;
          pNVar3->parent = x;
          x->right = pNVar3;
          pNVar4 = x;
          x = pNVar3;
        }
        pNVar5 = pNVar4->left;
        pNVar3 = pNVar4->parent;
        if (pNVar5 != pNVar2) {
          pNVar5->parent = pNVar3;
        }
        pNVar3->right = pNVar5;
        pNVar5 = pNVar3->parent;
        (&pNVar5->left)[pNVar5->left != pNVar3] = pNVar4;
        pNVar4->parent = pNVar5;
        pNVar3->parent = pNVar4;
        pNVar4->left = pNVar3;
LAB_00118b44:
        cVar1 = pNVar4->color;
        pNVar4->color = pNVar3->color;
        pNVar3->color = cVar1;
      }
      ppNVar6 = &x->parent;
      pNVar3 = x->parent;
    } while (pNVar3->color == RED);
  }
  this->nil->left->color = BLACK;
  return;
}

Assistant:

void insert_fixup(Node *x)
	{
		for (Node *y;x -> parent -> color == RED;)
			if (x -> parent -> parent -> left == x -> parent)
			{
				y = x -> parent -> parent -> right;
				if (y -> color == RED)
				{
					x -> parent -> color = y -> color = BLACK , y -> parent -> color = RED;
					x = y -> parent;
				}
				else
				{
					y = x -> parent;
					if (y -> right == x) left_rotate(x) , x = y , y = x -> parent;
					right_rotate(y) , std::swap(y -> color , y -> right -> color);
				}
			}
			else
			{
				y = x -> parent -> parent -> left;
				if (y -> color == RED)
				{
					x -> parent -> color = y -> color = BLACK , y -> parent -> color = RED;
					x = y -> parent;
				}
				else
				{
					y = x -> parent;
					if (y -> left == x) right_rotate(x) , x = y , y = x -> parent;
					left_rotate(y) , std::swap(y -> color , y -> left -> color);
				}
			}
		nil -> left -> color = BLACK;
	}